

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emulator.c
# Opt level: O3

void do_ppu_mode2(Emulator *e)

{
  Obj *pOVar1;
  byte bVar2;
  u8 uVar3;
  bool bVar4;
  u8 uVar5;
  u8 uVar6;
  undefined1 uVar7;
  u8 uVar8;
  ObjPriority OVar9;
  Bool BVar10;
  Bool BVar11;
  uint uVar12;
  long lVar13;
  ulong uVar14;
  Obj *pOVar15;
  
  dma_synchronize(e);
  if (((e->state).ppu.lcdc.obj_display != FALSE) && ((e->config).disable_obj == FALSE)) {
    bVar2 = "\b\x10"[(e->state).ppu.lcdc.obj_size];
    uVar3 = (e->state).ppu.line_y;
    lVar13 = 0;
    uVar12 = 0;
    do {
      if ((byte)(uVar3 - (e->state).oam[lVar13].y) < bVar2) {
        pOVar1 = (e->state).oam + lVar13;
        uVar14 = (ulong)uVar12;
        if (0 < (int)uVar12 && (e->state).is_cgb == FALSE) {
          pOVar15 = (e->state).ppu.line_obj + ((ulong)uVar12 - 1);
          uVar14 = (ulong)uVar12;
          do {
            if (pOVar15->x <= pOVar1->x) goto LAB_0010c378;
            uVar5 = pOVar15->bank;
            uVar6 = pOVar15->cgb_palette;
            uVar7 = pOVar15->field_0x13;
            pOVar15[1].palette = pOVar15->palette;
            pOVar15[1].bank = uVar5;
            pOVar15[1].cgb_palette = uVar6;
            pOVar15[1].field_0x13 = uVar7;
            uVar5 = pOVar15->x;
            uVar6 = pOVar15->tile;
            uVar8 = pOVar15->byte3;
            OVar9 = pOVar15->priority;
            BVar10 = pOVar15->yflip;
            BVar11 = pOVar15->xflip;
            pOVar15[1].y = pOVar15->y;
            pOVar15[1].x = uVar5;
            pOVar15[1].tile = uVar6;
            pOVar15[1].byte3 = uVar8;
            pOVar15[1].priority = OVar9;
            pOVar15[1].yflip = BVar10;
            pOVar15[1].xflip = BVar11;
            pOVar15 = pOVar15 + -1;
            bVar4 = 1 < uVar14;
            uVar14 = uVar14 - 1;
          } while (bVar4);
          uVar14 = 0;
        }
LAB_0010c378:
        uVar5 = pOVar1->bank;
        uVar6 = pOVar1->cgb_palette;
        uVar7 = pOVar1->field_0x13;
        pOVar15 = (e->state).ppu.line_obj + (int)uVar14;
        pOVar15->palette = pOVar1->palette;
        pOVar15->bank = uVar5;
        pOVar15->cgb_palette = uVar6;
        pOVar15->field_0x13 = uVar7;
        uVar5 = pOVar1->x;
        uVar6 = pOVar1->tile;
        uVar8 = pOVar1->byte3;
        OVar9 = pOVar1->priority;
        BVar10 = pOVar1->yflip;
        BVar11 = pOVar1->xflip;
        pOVar15 = (e->state).ppu.line_obj + (int)uVar14;
        pOVar15->y = pOVar1->y;
        pOVar15->x = uVar5;
        pOVar15->tile = uVar6;
        pOVar15->byte3 = uVar8;
        pOVar15->priority = OVar9;
        pOVar15->yflip = BVar10;
        pOVar15->xflip = BVar11;
        uVar12 = uVar12 + 1;
        if (uVar12 == 10) {
          uVar12 = 10;
          break;
        }
      }
      lVar13 = lVar13 + 1;
    } while (lVar13 != 0x28);
    (e->state).ppu.line_obj_count = (u8)uVar12;
  }
  return;
}

Assistant:

static void do_ppu_mode2(Emulator* e) {
  dma_synchronize(e);
  if (!LCDC.obj_display || e->config.disable_obj) {
    return;
  }

  int line_obj_count = 0;
  int i;
  u8 obj_height = s_obj_size_to_height[LCDC.obj_size];
  u8 y = PPU.line_y;
  for (i = 0; i < OBJ_COUNT; ++i) {
    /* Put the visible sprites into line_obj. Insert them so sprites with
     * smaller X-coordinates are earlier, but only on DMG. On CGB, they are
     * always ordered by obj index. */
    Obj* o = &OAM[i];
    u8 rel_y = y - o->y;
    if (rel_y < obj_height) {
      int j = line_obj_count;
      if (!IS_CGB) {
        while (j > 0 && o->x < PPU.line_obj[j - 1].x) {
          PPU.line_obj[j] = PPU.line_obj[j - 1];
          j--;
        }
      }
      PPU.line_obj[j] = *o;
      if (++line_obj_count == OBJ_PER_LINE_COUNT) {
        break;
      }
    }
  }
  PPU.line_obj_count = line_obj_count;
}